

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O3

UConverter * ucnv_createConverter_63(UConverter *myUConverter,char *converterName,UErrorCode *err)

{
  UConverterSharedData *mySharedConverterData;
  UConverter *pUVar1;
  UConverterLoadArgs stackArgs;
  UConverterNamePieces stackPieces;
  UConverterLoadArgs local_128;
  UConverterNamePieces local_f8;
  
  local_128.onlyTestIsLoadable = '\0';
  local_128.reserved0 = '\0';
  local_128.reserved = 0;
  local_128.options = 0;
  local_128.pkg = (char *)0x0;
  local_128.name = (char *)0x0;
  local_128.locale = (char *)0x0;
  local_128.size = 0x28;
  local_128.nestedLoads = 0;
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    mySharedConverterData = ucnv_loadSharedData_63(converterName,&local_f8,&local_128,err);
    pUVar1 = ucnv_createConverterFromSharedData_63
                       (myUConverter,mySharedConverterData,&local_128,err);
    if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
      return pUVar1;
    }
  }
  return (UConverter *)0x0;
}

Assistant:

U_CAPI UConverter *
ucnv_createConverter(UConverter *myUConverter, const char *converterName, UErrorCode * err)
{
    UConverterNamePieces stackPieces;
    UConverterLoadArgs stackArgs=UCNV_LOAD_ARGS_INITIALIZER;
    UConverterSharedData *mySharedConverterData;

    UTRACE_ENTRY_OC(UTRACE_UCNV_OPEN);

    if(U_SUCCESS(*err)) {
        UTRACE_DATA1(UTRACE_OPEN_CLOSE, "open converter %s", converterName);

        mySharedConverterData = ucnv_loadSharedData(converterName, &stackPieces, &stackArgs, err);

        myUConverter = ucnv_createConverterFromSharedData(
            myUConverter, mySharedConverterData,
            &stackArgs,
            err);

        if(U_SUCCESS(*err)) {
            UTRACE_EXIT_PTR_STATUS(myUConverter, *err);
            return myUConverter;
        }
    }

    /* exit with error */
    UTRACE_EXIT_STATUS(*err);
    return NULL;
}